

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O2

void ReadStringFromFile(FILE *file_ptr,string *str)

{
  ostream *poVar1;
  Logger *this;
  allocator local_69;
  Logger local_68;
  allocator local_61;
  size_t len;
  string local_58;
  string local_38;
  
  if (file_ptr == (FILE *)0x0) {
    len = CONCAT44(len._4_4_,2);
    std::__cxx11::string::string
              ((string *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,(allocator *)&local_68);
    std::__cxx11::string::string((string *)&local_38,"ReadStringFromFile",&local_69);
    poVar1 = Logger::Start(ERR,&local_58,0x135,&local_38);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x135);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"file_ptr");
    std::operator<<(poVar1," == NULL \n");
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    this = (Logger *)&len;
  }
  else {
    len = 0;
    ReadDataFromDisk(file_ptr,(char *)&len,8);
    if (len != 0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::swap((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::resize((ulong)str);
      ReadDataFromDisk(file_ptr,(str->_M_dataplus)._M_p,len);
      return;
    }
    local_68.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_69);
    std::__cxx11::string::string((string *)&local_38,"ReadStringFromFile",&local_61);
    poVar1 = Logger::Start(ERR,&local_58,0x139,&local_38);
    poVar1 = std::operator<<(poVar1,"CHECK_GT failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x139);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"len");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"0");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    this = &local_68;
  }
  Logger::~Logger(this);
  abort();
}

Assistant:

inline void ReadStringFromFile(FILE *file_ptr, std::string &str) {
  CHECK_NOTNULL(file_ptr);
  // First, read the length of vector
  size_t len = 0;
  ReadDataFromDisk(file_ptr, reinterpret_cast<char *>(&len), sizeof(len));
  CHECK_GT(len, 0);
  // Clear the original string
  std::string().swap(str);
  str.resize(len);
  ReadDataFromDisk(file_ptr, const_cast<char *>(str.data()), len);
}